

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globalcontext.cc
# Opt level: O2

void __thiscall
ContextInternal::restoreXml(ContextInternal *this,Element *el,AddrSpaceManager *manage)

{
  Element *el_00;
  bool bVar1;
  vector<TrackedContext,_std::allocator<TrackedContext>_> *vec;
  LowlevelError *this_00;
  pointer ppEVar2;
  Address local_60;
  Address addr;
  
  ppEVar2 = (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (ppEVar2 ==
        (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return;
    }
    el_00 = *ppEVar2;
    bVar1 = std::operator==(&el_00->name,"context_pointset");
    if (bVar1) {
      if ((int)((ulong)((long)(el_00->attr).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(el_00->attr).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5) == 0) {
        addr.base = (AddrSpace *)0x0;
      }
      else {
        Address::restoreXml(&addr,el_00,manage);
      }
      local_60.base = (AddrSpace *)0x0;
      restoreContext(this,el_00,&addr,&local_60);
    }
    else {
      bVar1 = std::operator==(&el_00->name,"tracked_pointset");
      if (!bVar1) {
        this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr,
                       "Bad <context_points> tag: ",&el_00->name);
        LowlevelError::LowlevelError(this_00,(string *)&addr);
        __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
      }
      Address::restoreXml(&addr,el_00,manage);
      vec = partmap<Address,_std::vector<TrackedContext,_std::allocator<TrackedContext>_>_>::split
                      (&this->trackbase,&addr);
      ContextDatabase::restoreTracked(el_00,manage,vec);
    }
    ppEVar2 = ppEVar2 + 1;
  } while( true );
}

Assistant:

void ContextInternal::restoreXml(const Element *el,const AddrSpaceManager *manage)

{
  const List &list(el->getChildren());
  List::const_iterator iter = list.begin();

  while(iter != list.end()) {
    const Element *subel = *iter;
    if (subel->getName() == "context_pointset") {
      if (subel->getNumAttributes()==0) {
	restoreContext(subel,Address(),Address());	// Restore the default value
      }
      else {
	Address addr = Address::restoreXml(subel,manage);
	restoreContext(subel,addr,Address());
      }
    }
    else if (subel->getName() == "tracked_pointset") {
      Address addr = Address::restoreXml(subel,manage);
      restoreTracked(subel,manage,trackbase.split(addr) );
    }
    else
      throw LowlevelError("Bad <context_points> tag: "+subel->getName());
    ++iter;
  }
}